

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol.c
# Opt level: O3

int AndersonAcc(KINMem kin_mem,N_Vector gval,N_Vector fv,N_Vector x,N_Vector xold,long iter,
               sunrealtype *R,sunrealtype *gamma)

{
  N_Vector_Ops p_Var1;
  sunrealtype *psVar2;
  N_Vector *pp_Var3;
  long *plVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  sunrealtype *psVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  double *pdVar12;
  ulong uVar13;
  double *pdVar14;
  sunrealtype *psVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  bool bVar21;
  double dVar22;
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  
  p_Var1 = kin_mem->kin_vtemp2->ops;
  if ((p_Var1->nvdotprodlocal == (_func_sunrealtype_N_Vector_N_Vector *)0x0) &&
     (p_Var1->nvdotprodmultilocal ==
      (_func_SUNErrCode_int_N_Vector_N_Vector_ptr_sunrealtype_ptr *)0x0)) {
    bVar21 = true;
  }
  else {
    bVar21 = p_Var1->nvdotprodmultiallreduce == (_func_SUNErrCode_int_N_Vector_sunrealtype_ptr *)0x0
    ;
  }
  psVar2 = kin_mem->kin_cv;
  pp_Var3 = kin_mem->kin_Xv;
  plVar4 = kin_mem->kin_ipt_map;
  lVar19 = iter + -1;
  uVar11 = lVar19 % kin_mem->kin_m_aa;
  N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,gval,xold,fv);
  if (0 < iter) {
    N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,gval,kin_mem->kin_gold_aa,
                 kin_mem->kin_dg_aa[uVar11]);
    N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,fv,kin_mem->kin_fold_aa,
                 kin_mem->kin_df_aa[uVar11]);
  }
  N_VScale(0x3ff0000000000000,gval,kin_mem->kin_gold_aa);
  N_VScale(0x3ff0000000000000,fv);
  if (iter == 1) {
    dVar23 = (double)N_VDotProd(kin_mem->kin_df_aa[uVar11],kin_mem->kin_df_aa[uVar11]);
    dVar22 = 0.0;
    if (0.0 < dVar23) {
      dVar22 = (double)N_VDotProd(kin_mem->kin_df_aa[uVar11],kin_mem->kin_df_aa[uVar11]);
      if (dVar22 < 0.0) {
        dVar22 = sqrt(dVar22);
      }
      else {
        dVar22 = SQRT(dVar22);
      }
    }
    *R = dVar22;
    N_VScale(1.0 / dVar22,kin_mem->kin_df_aa[uVar11],kin_mem->kin_q_aa[uVar11]);
    *plVar4 = 0;
  }
  else {
    if (iter == 0) {
      if (kin_mem->kin_damping_aa == 0) {
        iVar6 = N_VScale(0x3ff0000000000000,gval,x);
        return iVar6;
      }
      iVar6 = N_VLinearSum(1.0 - kin_mem->kin_beta,kin_mem->kin_beta_aa,xold,gval,x);
      return iVar6;
    }
    uVar16 = kin_mem->kin_m_aa;
    if ((long)uVar16 < iter) {
      if ((long)uVar16 < 2) {
        bVar5 = false;
      }
      else {
        lVar18 = 0x10;
        psVar8 = R;
        lVar19 = 0;
        do {
          lVar20 = lVar19 + 1;
          lVar7 = lVar20 * uVar16;
          dVar23 = R[lVar7 + lVar19];
          dVar22 = R[lVar7 + lVar19 + 1];
          auVar31._8_8_ = dVar23;
          auVar31._0_8_ = dVar22;
          dVar23 = dVar23 * dVar23 + dVar22 * dVar22;
          auVar26._0_8_ = (sunrealtype)(-(ulong)(0.0 < dVar23) & (ulong)SQRT(dVar23));
          R[lVar7 + lVar19] = auVar26._0_8_;
          auVar26._8_8_ = auVar26._0_8_;
          auVar26 = divpd(auVar31,auVar26);
          R[lVar7 + lVar19 + 1] = 0.0;
          if ((lVar19 < (long)(uVar16 - 1)) && (lVar7 = lVar19 + 2, lVar7 < (long)uVar16)) {
            lVar10 = uVar16 * lVar18;
            do {
              dVar23 = *(double *)((long)psVar8 + lVar10 + 8);
              auVar28._0_8_ =
                   *(double *)((long)psVar8 + lVar10) * auVar26._8_8_ + dVar23 * auVar26._0_8_;
              auVar28._8_8_ =
                   *(double *)((long)psVar8 + lVar10) * -auVar26._0_8_ + dVar23 * auVar26._8_8_;
              *(undefined1 (*) [16])((long)psVar8 + lVar10) = auVar28;
              lVar7 = lVar7 + 1;
              lVar10 = lVar10 + uVar16 * 8;
            } while (lVar7 < (long)uVar16);
          }
          N_VLinearSum(kin_mem->kin_q_aa[lVar19],kin_mem->kin_q_aa[lVar20],kin_mem->kin_vtemp2);
          N_VLinearSum(kin_mem->kin_q_aa[lVar19],kin_mem->kin_q_aa[lVar20]);
          N_VScale(0x3ff0000000000000,kin_mem->kin_vtemp2);
          uVar16 = kin_mem->kin_m_aa;
          psVar8 = psVar8 + 1;
          lVar18 = lVar18 + 8;
          lVar19 = lVar20;
        } while (lVar20 < (long)(uVar16 - 1));
        bVar5 = 1 < (long)uVar16;
        if ((long)uVar16 < 2) {
          bVar5 = false;
        }
        else {
          psVar8 = R + uVar16;
          uVar13 = 1;
          psVar15 = R;
          do {
            uVar17 = 1;
            do {
              psVar15[uVar17 - 1] = psVar8[uVar17 - 1];
              uVar17 = uVar17 + 1;
            } while (uVar16 != uVar17);
            uVar13 = uVar13 + 1;
            psVar8 = psVar8 + uVar16;
            psVar15 = psVar15 + uVar16;
          } while (uVar13 != uVar16);
        }
      }
      if (kin_mem->kin_orth_aa == 1) {
        if (bVar21) {
          psVar8 = kin_mem->kin_T_aa;
          *psVar8 = 1.0;
          if (2 < (long)uVar16) {
            uVar13 = 1;
            do {
              N_VDotProdMulti(uVar13 & 0xffffffff,kin_mem->kin_q_aa[uVar13],kin_mem->kin_q_aa,
                              psVar8 + uVar16 * uVar13);
              psVar8 = kin_mem->kin_T_aa;
              uVar16 = kin_mem->kin_m_aa;
              psVar8[(uVar16 + 1) * uVar13] = 1.0;
              lVar19 = uVar13 + 2;
              uVar13 = uVar13 + 1;
            } while (lVar19 < (long)uVar16);
          }
        }
        else {
          if (bVar5) {
            uVar17 = 2;
            uVar13 = 2;
            if (uVar16 != 2) {
              do {
                N_VDotProdMultiLocal
                          (uVar17 & 0xffffffff,kin_mem->kin_q_aa[uVar17 - 1],kin_mem->kin_q_aa,
                           kin_mem->kin_T_aa + (uVar17 - 1) * uVar16);
                uVar17 = uVar17 + 1;
                uVar13 = kin_mem->kin_m_aa;
                uVar16 = uVar13;
              } while ((long)uVar17 < (long)uVar13);
            }
            N_VDotProdMultiAllReduce
                      ((int)uVar13 * (int)uVar13,kin_mem->kin_q_aa[uVar17 - 1],kin_mem->kin_T_aa);
            uVar16 = kin_mem->kin_m_aa;
          }
          auVar32 = _DAT_0011a100;
          auVar26 = _DAT_0011a0f0;
          if (1 < (long)uVar16) {
            psVar8 = kin_mem->kin_T_aa;
            lVar19 = uVar16 - 2;
            auVar24._8_4_ = (int)lVar19;
            auVar24._0_8_ = lVar19;
            auVar24._12_4_ = (int)((ulong)lVar19 >> 0x20);
            uVar13 = 0;
            auVar24 = auVar24 ^ _DAT_0011a100;
            do {
              auVar29._8_4_ = (int)uVar13;
              auVar29._0_8_ = uVar13;
              auVar29._12_4_ = (int)(uVar13 >> 0x20);
              auVar30 = (auVar29 | auVar26) ^ auVar32;
              if ((bool)(~(auVar30._4_4_ == auVar24._4_4_ && auVar24._0_4_ < auVar30._0_4_ ||
                          auVar24._4_4_ < auVar30._4_4_) & 1)) {
                *psVar8 = 1.0;
              }
              if ((auVar30._12_4_ != auVar24._12_4_ || auVar30._8_4_ <= auVar24._8_4_) &&
                  auVar30._12_4_ <= auVar24._12_4_) {
                psVar8[uVar16 + 1] = 1.0;
              }
              uVar13 = uVar13 + 2;
              psVar8 = psVar8 + uVar16 * 2 + 2;
            } while ((uVar16 & 0x7ffffffffffffffe) != uVar13);
          }
        }
      }
      (*kin_mem->kin_qr_func)
                (kin_mem->kin_q_aa,R,kin_mem->kin_df_aa[uVar11],(int)uVar16 + -1,(int)uVar16,
                 kin_mem->kin_qr_data);
      lVar19 = uVar11 + 1;
      if (lVar19 < kin_mem->kin_m_aa) {
        lVar7 = 0;
        do {
          lVar18 = lVar7 + 1;
          plVar4[lVar7] = lVar19 + lVar7;
          lVar20 = lVar19 + lVar7;
          lVar7 = lVar18;
        } while (lVar20 + 1 < kin_mem->kin_m_aa);
      }
      else {
        lVar18 = 0;
      }
      auVar26 = _DAT_0011a100;
      if (-1 < (long)uVar11) {
        auVar25._8_4_ = (int)uVar11;
        auVar25._0_8_ = uVar11;
        auVar25._12_4_ = (int)(uVar11 >> 0x20);
        lVar19 = 0;
        auVar25 = auVar25 ^ _DAT_0011a100;
        auVar27 = _DAT_0011a0f0;
        do {
          auVar32 = auVar27 ^ auVar26;
          if ((bool)(~(auVar32._4_4_ == auVar25._4_4_ && auVar25._0_4_ < auVar32._0_4_ ||
                      auVar25._4_4_ < auVar32._4_4_) & 1)) {
            plVar4[lVar18 + lVar19] = lVar19;
          }
          if ((auVar32._12_4_ != auVar25._12_4_ || auVar32._8_4_ <= auVar25._8_4_) &&
              auVar32._12_4_ <= auVar25._12_4_) {
            plVar4[lVar18 + lVar19 + 1] = lVar19 + 1;
          }
          lVar19 = lVar19 + 2;
          lVar7 = auVar27._8_8_;
          auVar27._0_8_ = auVar27._0_8_ + 2;
          auVar27._8_8_ = lVar7 + 2;
        } while ((uVar11 & 0x7ffffffffffffffe) + 2 != lVar19);
      }
    }
    else {
      (*kin_mem->kin_qr_func)
                (kin_mem->kin_q_aa,R,kin_mem->kin_df_aa[uVar11],(int)iter + -1,(int)uVar16,
                 kin_mem->kin_qr_data);
      auVar26 = _DAT_0011a100;
      if (0 < iter) {
        auVar30._8_4_ = (int)lVar19;
        auVar30._0_8_ = lVar19;
        auVar30._12_4_ = (int)((ulong)lVar19 >> 0x20);
        uVar11 = 0;
        auVar30 = auVar30 ^ _DAT_0011a100;
        auVar32 = _DAT_0011a0f0;
        do {
          auVar31 = auVar32 ^ auVar26;
          if ((bool)(~(auVar31._4_4_ == auVar30._4_4_ && auVar30._0_4_ < auVar31._0_4_ ||
                      auVar30._4_4_ < auVar31._4_4_) & 1)) {
            plVar4[uVar11] = uVar11;
          }
          if ((auVar31._12_4_ != auVar30._12_4_ || auVar31._8_4_ <= auVar30._8_4_) &&
              auVar31._12_4_ <= auVar30._12_4_) {
            plVar4[uVar11 + 1] = uVar11 + 1;
          }
          uVar11 = uVar11 + 2;
          lVar19 = auVar32._8_8_;
          auVar32._0_8_ = auVar32._0_8_ + 2;
          auVar32._8_8_ = lVar19 + 2;
        } while ((iter + 1U & 0xfffffffffffffffe) != uVar11);
      }
    }
  }
  if (kin_mem->kin_m_aa < iter) {
    iter = kin_mem->kin_m_aa;
  }
  iVar6 = N_VDotProdMulti(iter & 0xffffffff,fv,kin_mem->kin_q_aa,gamma);
  if (iVar6 == 0) {
    *psVar2 = 1.0;
    *pp_Var3 = gval;
    lVar19 = iter - 1;
    if (iter < 1) {
      uVar11 = 1;
    }
    else {
      lVar18 = kin_mem->kin_m_aa;
      pdVar14 = (double *)((long)R + (lVar18 * 8 + 8) * iter + -8);
      lVar20 = 0;
      uVar11 = 1;
      lVar7 = lVar19;
      do {
        dVar23 = gamma[lVar7];
        pdVar12 = pdVar14;
        lVar10 = lVar20;
        if (lVar7 + 1 < iter) {
          do {
            dVar23 = dVar23 - *pdVar12 * gamma[iter + lVar10];
            gamma[lVar7] = dVar23;
            lVar10 = lVar10 + 1;
            pdVar12 = pdVar12 + lVar18;
          } while (lVar10 != 0);
        }
        dVar22 = R[(lVar18 + 1) * lVar7];
        gamma[lVar7] = dVar23 / dVar22;
        psVar2[uVar11] = -(dVar23 / dVar22);
        pp_Var3[uVar11] = kin_mem->kin_dg_aa[plVar4[lVar7]];
        lVar7 = lVar7 + -1;
        lVar20 = lVar20 + -1;
        pdVar14 = (double *)((long)pdVar14 + (lVar18 * 8 ^ 0xfffffffffffffff8U));
        bVar21 = uVar11 != iter;
        uVar11 = uVar11 + 1;
      } while (bVar21);
      uVar11 = (ulong)((int)iter + 1);
    }
    if (kin_mem->kin_damping_aa != 0) {
      uVar9 = (int)uVar11 + 1;
      dVar23 = 1.0 - kin_mem->kin_beta_aa;
      psVar2[uVar11] = -dVar23;
      pp_Var3[uVar11] = fv;
      if (iter < 1) {
        uVar11 = (ulong)uVar9;
      }
      else {
        uVar11 = 0;
        do {
          psVar2[uVar9 + uVar11] = gamma[lVar19] * dVar23;
          pp_Var3[uVar9 + uVar11] = kin_mem->kin_df_aa[plVar4[lVar19]];
          lVar19 = lVar19 + -1;
          uVar11 = uVar11 + 1;
        } while (iter != uVar11);
        uVar11 = (ulong)(uVar9 + (int)uVar11);
      }
    }
    iVar6 = N_VLinearCombination(uVar11,psVar2,pp_Var3,x);
    return iVar6;
  }
  return iVar6;
}

Assistant:

static int AndersonAcc(KINMem kin_mem, N_Vector gval, N_Vector fv, N_Vector x,
                       N_Vector xold, long int iter, sunrealtype* R,
                       sunrealtype* gamma)
{
  int retval;
  long int i_pt, i, j, lAA;
  long int* ipt_map;
  sunrealtype alfa;
  sunrealtype onembeta;
  sunrealtype a, b, temp, c, s;
  sunbooleantype dotprodSB = SUNFALSE;

  /* local shortcuts for fused vector operation */
  int nvec        = 0;
  sunrealtype* cv = kin_mem->kin_cv;
  N_Vector* Xv    = kin_mem->kin_Xv;

  /* local dot product flag for single buffer reductions */
  if ((kin_mem->kin_vtemp2->ops->nvdotprodlocal ||
       kin_mem->kin_vtemp2->ops->nvdotprodmultilocal) &&
      kin_mem->kin_vtemp2->ops->nvdotprodmultiallreduce)
  {
    dotprodSB = SUNTRUE;
  }

  ipt_map = kin_mem->kin_ipt_map;
  i_pt    = iter - 1 - ((iter - 1) / kin_mem->kin_m_aa) * kin_mem->kin_m_aa;
  N_VLinearSum(ONE, gval, -ONE, xold, fv);
  if (iter > 0)
  {
    /* compute dg_new = gval - gval_old */
    N_VLinearSum(ONE, gval, -ONE, kin_mem->kin_gold_aa, kin_mem->kin_dg_aa[i_pt]);
    /* compute df_new = fval - fval_old */
    N_VLinearSum(ONE, fv, -ONE, kin_mem->kin_fold_aa, kin_mem->kin_df_aa[i_pt]);
  }

  N_VScale(ONE, gval, kin_mem->kin_gold_aa);
  N_VScale(ONE, fv, kin_mem->kin_fold_aa);

  /* on first iteration, do fixed point update */
  if (iter == 0)
  {
    if (kin_mem->kin_damping_aa)
    {
      /* damped fixed point */
      N_VLinearSum((ONE - kin_mem->kin_beta), xold, kin_mem->kin_beta_aa, gval,
                   x);
    }
    else
    {
      /* standard fixed point */
      N_VScale(ONE, gval, x);
    }
    return (0);
  }

  /* update data structures based on current iteration index */

  if (iter == 1)
  {
    /* second iteration */
    R[0] =
      SUNRsqrt(N_VDotProd(kin_mem->kin_df_aa[i_pt], kin_mem->kin_df_aa[i_pt]));
    alfa = ONE / R[0];
    N_VScale(alfa, kin_mem->kin_df_aa[i_pt], kin_mem->kin_q_aa[i_pt]);
    ipt_map[0] = 0;
  }
  else if (iter <= kin_mem->kin_m_aa)
  {
    /* another iteration before we've reached maa */

    kin_mem->kin_qr_func(kin_mem->kin_q_aa, R, kin_mem->kin_df_aa[i_pt],
                         (int)iter - 1, (int)kin_mem->kin_m_aa,
                         (void*)kin_mem->kin_qr_data);

    /* update iteration map */
    for (j = 0; j < iter; j++) { ipt_map[j] = j; }
  }
  else
  {
    /* we've filled the acceleration subspace, so start recycling */

    /* Delete left-most column vector from QR factorization */
    for (i = 0; i < kin_mem->kin_m_aa - 1; i++)
    {
      a    = R[(i + 1) * kin_mem->kin_m_aa + i];
      b    = R[(i + 1) * kin_mem->kin_m_aa + i + 1];
      temp = SUNRsqrt(a * a + b * b);
      c    = a / temp;
      s    = b / temp;
      R[(i + 1) * kin_mem->kin_m_aa + i]     = temp;
      R[(i + 1) * kin_mem->kin_m_aa + i + 1] = ZERO;
      /* OK to re-use temp */
      if (i < kin_mem->kin_m_aa - 1)
      {
        for (j = i + 2; j < kin_mem->kin_m_aa; j++)
        {
          a                                = R[j * kin_mem->kin_m_aa + i];
          b                                = R[j * kin_mem->kin_m_aa + i + 1];
          temp                             = c * a + s * b;
          R[j * kin_mem->kin_m_aa + i + 1] = -s * a + c * b;
          R[j * kin_mem->kin_m_aa + i]     = temp;
        }
      }
      N_VLinearSum(c, kin_mem->kin_q_aa[i], s, kin_mem->kin_q_aa[i + 1],
                   kin_mem->kin_vtemp2);
      N_VLinearSum(-s, kin_mem->kin_q_aa[i], c, kin_mem->kin_q_aa[i + 1],
                   kin_mem->kin_q_aa[i + 1]);
      N_VScale(ONE, kin_mem->kin_vtemp2, kin_mem->kin_q_aa[i]);
    }

    /* Shift R to the left by one. */
    for (i = 1; i < kin_mem->kin_m_aa; i++)
    {
      for (j = 0; j < kin_mem->kin_m_aa - 1; j++)
      {
        R[(i - 1) * kin_mem->kin_m_aa + j] = R[i * kin_mem->kin_m_aa + j];
      }
    }

    /* If ICWY orthogonalization, then update T */
    if (kin_mem->kin_orth_aa == KIN_ORTH_ICWY)
    {
      if (dotprodSB)
      {
        if (i > 1)
        {
          for (i = 2; i < kin_mem->kin_m_aa; i++)
          {
            N_VDotProdMultiLocal((int)i, kin_mem->kin_q_aa[i - 1],
                                 kin_mem->kin_q_aa,
                                 kin_mem->kin_T_aa + (i - 1) * kin_mem->kin_m_aa);
          }
          N_VDotProdMultiAllReduce((int)(kin_mem->kin_m_aa * kin_mem->kin_m_aa),
                                   kin_mem->kin_q_aa[i - 1], kin_mem->kin_T_aa);
        }
        for (i = 1; i < kin_mem->kin_m_aa; i++)
        {
          kin_mem->kin_T_aa[(i - 1) * kin_mem->kin_m_aa + (i - 1)] = ONE;
        }
      }
      else
      {
        kin_mem->kin_T_aa[0] = ONE;
        for (i = 2; i < kin_mem->kin_m_aa; i++)
        {
          N_VDotProdMulti((int)i - 1, kin_mem->kin_q_aa[i - 1], kin_mem->kin_q_aa,
                          kin_mem->kin_T_aa + (i - 1) * kin_mem->kin_m_aa);
          kin_mem->kin_T_aa[(i - 1) * kin_mem->kin_m_aa + (i - 1)] = ONE;
        }
      }
    }

    /* Add the new df vector */
    kin_mem->kin_qr_func(kin_mem->kin_q_aa, R, kin_mem->kin_df_aa[i_pt],
                         (int)kin_mem->kin_m_aa - 1, (int)kin_mem->kin_m_aa,
                         (void*)kin_mem->kin_qr_data);

    /* Update the iteration map */
    j = 0;
    for (i = i_pt + 1; i < kin_mem->kin_m_aa; i++) { ipt_map[j++] = i; }
    for (i = 0; i < (i_pt + 1); i++) { ipt_map[j++] = i; }
  }

  /* Solve least squares problem and update solution */
  lAA = iter;
  if (kin_mem->kin_m_aa < iter) { lAA = kin_mem->kin_m_aa; }

  retval = N_VDotProdMulti((int)lAA, fv, kin_mem->kin_q_aa, gamma);
  if (retval != KIN_SUCCESS) { return (KIN_VECTOROP_ERR); }

  /* set arrays for fused vector operation */
  cv[0] = ONE;
  Xv[0] = gval;
  nvec  = 1;

  for (i = lAA - 1; i > -1; i--)
  {
    for (j = i + 1; j < lAA; j++)
    {
      gamma[i] = gamma[i] - R[j * kin_mem->kin_m_aa + i] * gamma[j];
    }
    gamma[i] = gamma[i] / R[i * kin_mem->kin_m_aa + i];

    cv[nvec] = -gamma[i];
    Xv[nvec] = kin_mem->kin_dg_aa[ipt_map[i]];
    nvec += 1;
  }

  /* if enabled, apply damping */
  if (kin_mem->kin_damping_aa)
  {
    onembeta = (ONE - kin_mem->kin_beta_aa);
    cv[nvec] = -onembeta;
    Xv[nvec] = fv;
    nvec += 1;
    for (i = lAA - 1; i > -1; i--)
    {
      cv[nvec] = onembeta * gamma[i];
      Xv[nvec] = kin_mem->kin_df_aa[ipt_map[i]];
      nvec += 1;
    }
  }

  /* update solution */
  retval = N_VLinearCombination(nvec, cv, Xv, x);
  if (retval != KIN_SUCCESS) { return (KIN_VECTOROP_ERR); }

  return 0;
}